

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

json __thiscall Player::serializeHand_abi_cxx11_(Player *this)

{
  undefined8 *puVar1;
  json_value extraout_RDX;
  json_value jVar2;
  json_value extraout_RDX_00;
  long in_RSI;
  undefined8 *puVar3;
  json jVar4;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_30;
  
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)this,(nullptr_t)0x0);
  puVar1 = *(undefined8 **)(in_RSI + 0x10);
  jVar2 = extraout_RDX;
  for (puVar3 = *(undefined8 **)(in_RSI + 8); puVar3 != puVar1; puVar3 = puVar3 + 1) {
    (*(code *)**(undefined8 **)*puVar3)(&local_30);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)this,&local_30);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_30);
    jVar2 = extraout_RDX_00;
  }
  jVar4.m_value.object = jVar2.object;
  jVar4._0_8_ = this;
  return jVar4;
}

Assistant:

json Player::serializeHand() {
    json hand;
    for (auto c: _hand) {
        hand += c->serialize();
    }
    return hand;
}